

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void caffe::protobuf_caffe_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00720010 == '\x01') {
    DAT_00720010 = '\0';
    (*(code *)*_BlobShape_default_instance_)();
  }
  if (DAT_00721428 != (long *)0x0) {
    (**(code **)(*DAT_00721428 + 8))();
  }
  if (DAT_007200a8 == '\x01') {
    DAT_007200a8 = '\0';
    (*(code *)*_BlobProto_default_instance_)();
  }
  if (DAT_00721438 != (long *)0x0) {
    (**(code **)(*DAT_00721438 + 8))();
  }
  if (DAT_007200e0 == '\x01') {
    DAT_007200e0 = '\0';
    (*(code *)*_BlobProtoVector_default_instance_)();
  }
  if (DAT_00721448 != (long *)0x0) {
    (**(code **)(*DAT_00721448 + 8))();
  }
  if (DAT_00720130 == '\x01') {
    DAT_00720130 = '\0';
    (*(code *)*_Datum_default_instance_)();
  }
  if (DAT_00721458 != (long *)0x0) {
    (**(code **)(*DAT_00721458 + 8))();
  }
  if (DAT_00720178 == '\x01') {
    DAT_00720178 = '\0';
    (*(code *)*_FillerParameter_default_instance_)();
  }
  if (DAT_00721468 != (long *)0x0) {
    (**(code **)(*DAT_00721468 + 8))();
  }
  if (DAT_00721810 == '\x01') {
    DAT_00721810 = '\0';
    if (FillerParameter::_default_type__abi_cxx11_ != &DAT_00721800) {
      operator_delete(FillerParameter::_default_type__abi_cxx11_,DAT_00721800 + 1);
    }
  }
  if (DAT_00720220 == '\x01') {
    DAT_00720220 = '\0';
    (*(code *)*_NetParameter_default_instance_)();
  }
  if (DAT_00721478 != (long *)0x0) {
    (**(code **)(*DAT_00721478 + 8))();
  }
  if (DAT_00720358 == '\x01') {
    DAT_00720358 = '\0';
    (*(code *)*_SolverParameter_default_instance_)();
  }
  if (DAT_00721488 != (long *)0x0) {
    (**(code **)(*DAT_00721488 + 8))();
  }
  if (DAT_00721838 == '\x01') {
    DAT_00721838 = '\0';
    if (SolverParameter::_default_regularization_type__abi_cxx11_ != &DAT_00721828) {
      operator_delete(SolverParameter::_default_regularization_type__abi_cxx11_,DAT_00721828 + 1);
    }
  }
  if (DAT_00721860 == '\x01') {
    DAT_00721860 = '\0';
    if (SolverParameter::_default_type__abi_cxx11_ != &DAT_00721850) {
      operator_delete(SolverParameter::_default_type__abi_cxx11_,DAT_00721850 + 1);
    }
  }
  if (DAT_007203a0 == '\x01') {
    DAT_007203a0 = '\0';
    (*(code *)*_SolverState_default_instance_)();
  }
  if (DAT_00721498 != (long *)0x0) {
    (**(code **)(*DAT_00721498 + 8))();
  }
  if (DAT_007203e0 == '\x01') {
    DAT_007203e0 = '\0';
    (*(code *)*_NetState_default_instance_)();
  }
  if (DAT_007214a8 != (long *)0x0) {
    (**(code **)(*DAT_007214a8 + 8))();
  }
  if (DAT_00720440 == '\x01') {
    DAT_00720440 = '\0';
    (*(code *)*_NetStateRule_default_instance_)();
  }
  if (DAT_007214b8 != (long *)0x0) {
    (**(code **)(*DAT_007214b8 + 8))();
  }
  if (DAT_00720478 == '\x01') {
    DAT_00720478 = '\0';
    (*(code *)*_ParamSpec_default_instance_)();
  }
  if (DAT_007214c8 != (long *)0x0) {
    (**(code **)(*DAT_007214c8 + 8))();
  }
  if (DAT_007206d8 == '\x01') {
    DAT_007206d8 = '\0';
    (*(code *)*_LayerParameter_default_instance_)();
  }
  if (DAT_007214d8 != (long *)0x0) {
    (**(code **)(*DAT_007214d8 + 8))();
  }
  if (DAT_00720720 == '\x01') {
    DAT_00720720 = '\0';
    (*(code *)*_TransformationParameter_default_instance_)();
  }
  if (DAT_007214e8 != (long *)0x0) {
    (**(code **)(*DAT_007214e8 + 8))();
  }
  if (DAT_00720750 == '\x01') {
    DAT_00720750 = '\0';
    (*(code *)*_LossParameter_default_instance_)();
  }
  if (DAT_007214f8 != (long *)0x0) {
    (**(code **)(*DAT_007214f8 + 8))();
  }
  if (DAT_00720780 == '\x01') {
    DAT_00720780 = '\0';
    (*(code *)*_AccuracyParameter_default_instance_)();
  }
  if (DAT_00721508 != (long *)0x0) {
    (**(code **)(*DAT_00721508 + 8))();
  }
  if (DAT_007207b0 == '\x01') {
    DAT_007207b0 = '\0';
    (*(code *)*_ArgMaxParameter_default_instance_)();
  }
  if (DAT_00721518 != (long *)0x0) {
    (**(code **)(*DAT_00721518 + 8))();
  }
  if (DAT_007207d8 == '\x01') {
    DAT_007207d8 = '\0';
    (*(code *)*_ConcatParameter_default_instance_)();
  }
  if (DAT_00721528 != (long *)0x0) {
    (**(code **)(*DAT_00721528 + 8))();
  }
  if (DAT_00720808 == '\x01') {
    DAT_00720808 = '\0';
    (*(code *)*_BatchNormParameter_default_instance_)();
  }
  if (DAT_00721538 != (long *)0x0) {
    (**(code **)(*DAT_00721538 + 8))();
  }
  if (DAT_00720838 == '\x01') {
    DAT_00720838 = '\0';
    (*(code *)*_BiasParameter_default_instance_)();
  }
  if (DAT_00721548 != (long *)0x0) {
    (**(code **)(*DAT_00721548 + 8))();
  }
  if (DAT_00720860 == '\x01') {
    DAT_00720860 = '\0';
    (*(code *)*_ContrastiveLossParameter_default_instance_)();
  }
  if (DAT_00721558 != (long *)0x0) {
    (**(code **)(*DAT_00721558 + 8))();
  }
  if (DAT_00720900 == '\x01') {
    DAT_00720900 = '\0';
    (*(code *)*_ConvolutionParameter_default_instance_)();
  }
  if (DAT_00721568 != (long *)0x0) {
    (**(code **)(*DAT_00721568 + 8))();
  }
  if (DAT_00720938 == '\x01') {
    DAT_00720938 = '\0';
    (*(code *)*_CropParameter_default_instance_)();
  }
  if (DAT_00721578 != (long *)0x0) {
    (**(code **)(*DAT_00721578 + 8))();
  }
  if (DAT_00720988 == '\x01') {
    DAT_00720988 = '\0';
    (*(code *)*_DataParameter_default_instance_)();
  }
  if (DAT_00721588 != (long *)0x0) {
    (**(code **)(*DAT_00721588 + 8))();
  }
  if (DAT_007209b0 == '\x01') {
    DAT_007209b0 = '\0';
    (*(code *)*_DropoutParameter_default_instance_)();
  }
  if (DAT_00721598 != (long *)0x0) {
    (**(code **)(*DAT_00721598 + 8))();
  }
  if (DAT_00720a40 == '\x01') {
    DAT_00720a40 = '\0';
    (*(code *)*_DummyDataParameter_default_instance_)();
  }
  if (DAT_007215a8 != (long *)0x0) {
    (**(code **)(*DAT_007215a8 + 8))();
  }
  if (DAT_00720a78 == '\x01') {
    DAT_00720a78 = '\0';
    (*(code *)*_EltwiseParameter_default_instance_)();
  }
  if (DAT_007215b8 != (long *)0x0) {
    (**(code **)(*DAT_007215b8 + 8))();
  }
  if (DAT_00720aa0 == '\x01') {
    DAT_00720aa0 = '\0';
    (*(code *)*_ELUParameter_default_instance_)();
  }
  if (DAT_007215c8 != (long *)0x0) {
    (**(code **)(*DAT_007215c8 + 8))();
  }
  if (DAT_00720ae0 == '\x01') {
    DAT_00720ae0 = '\0';
    (*(code *)*_EmbedParameter_default_instance_)();
  }
  if (DAT_007215d8 != (long *)0x0) {
    (**(code **)(*DAT_007215d8 + 8))();
  }
  if (DAT_00720b10 == '\x01') {
    DAT_00720b10 = '\0';
    (*(code *)*_ExpParameter_default_instance_)();
  }
  if (DAT_007215e8 != (long *)0x0) {
    (**(code **)(*DAT_007215e8 + 8))();
  }
  if (DAT_00720b38 == '\x01') {
    DAT_00720b38 = '\0';
    (*(code *)*_FlattenParameter_default_instance_)();
  }
  if (DAT_007215f8 != (long *)0x0) {
    (**(code **)(*DAT_007215f8 + 8))();
  }
  if (DAT_00720b68 == '\x01') {
    DAT_00720b68 = '\0';
    (*(code *)*_HDF5DataParameter_default_instance_)();
  }
  if (DAT_00721608 != (long *)0x0) {
    (**(code **)(*DAT_00721608 + 8))();
  }
  if (DAT_00720b90 == '\x01') {
    DAT_00720b90 = '\0';
    (*(code *)*_HDF5OutputParameter_default_instance_)();
  }
  if (DAT_00721618 != (long *)0x0) {
    (**(code **)(*DAT_00721618 + 8))();
  }
  if (DAT_00720bb8 == '\x01') {
    DAT_00720bb8 = '\0';
    (*(code *)*_HingeLossParameter_default_instance_)();
  }
  if (DAT_00721628 != (long *)0x0) {
    (**(code **)(*DAT_00721628 + 8))();
  }
  if (DAT_00720c10 == '\x01') {
    DAT_00720c10 = '\0';
    (*(code *)*_ImageDataParameter_default_instance_)();
  }
  if (DAT_00721638 != (long *)0x0) {
    (**(code **)(*DAT_00721638 + 8))();
  }
  if (DAT_00720c38 == '\x01') {
    DAT_00720c38 = '\0';
    (*(code *)*_InfogainLossParameter_default_instance_)();
  }
  if (DAT_00721648 != (long *)0x0) {
    (**(code **)(*DAT_00721648 + 8))();
  }
  if (DAT_00720c78 == '\x01') {
    DAT_00720c78 = '\0';
    (*(code *)*_InnerProductParameter_default_instance_)();
  }
  if (DAT_00721658 != (long *)0x0) {
    (**(code **)(*DAT_00721658 + 8))();
  }
  if (DAT_00720cb0 == '\x01') {
    DAT_00720cb0 = '\0';
    (*(code *)*_InputParameter_default_instance_)();
  }
  if (DAT_00721668 != (long *)0x0) {
    (**(code **)(*DAT_00721668 + 8))();
  }
  if (DAT_00720ce0 == '\x01') {
    DAT_00720ce0 = '\0';
    (*(code *)*_LogParameter_default_instance_)();
  }
  if (DAT_00721678 != (long *)0x0) {
    (**(code **)(*DAT_00721678 + 8))();
  }
  if (DAT_00720d18 == '\x01') {
    DAT_00720d18 = '\0';
    (*(code *)*_LRNParameter_default_instance_)();
  }
  if (DAT_00721688 != (long *)0x0) {
    (**(code **)(*DAT_00721688 + 8))();
  }
  if (DAT_00720d48 == '\x01') {
    DAT_00720d48 = '\0';
    (*(code *)*_MemoryDataParameter_default_instance_)();
  }
  if (DAT_00721698 != (long *)0x0) {
    (**(code **)(*DAT_00721698 + 8))();
  }
  if (DAT_00720d70 == '\x01') {
    DAT_00720d70 = '\0';
    (*(code *)*_MVNParameter_default_instance_)();
  }
  if (DAT_007216a8 != (long *)0x0) {
    (**(code **)(*DAT_007216a8 + 8))();
  }
  if (DAT_00720d98 == '\x01') {
    DAT_00720d98 = '\0';
    (*(code *)*_ParameterParameter_default_instance_)();
  }
  if (DAT_007216b8 != (long *)0x0) {
    (**(code **)(*DAT_007216b8 + 8))();
  }
  if (DAT_00720de8 == '\x01') {
    DAT_00720de8 = '\0';
    (*(code *)*_PoolingParameter_default_instance_)();
  }
  if (DAT_007216c8 != (long *)0x0) {
    (**(code **)(*DAT_007216c8 + 8))();
  }
  if (DAT_00720e18 == '\x01') {
    DAT_00720e18 = '\0';
    (*(code *)*_PowerParameter_default_instance_)();
  }
  if (DAT_007216d8 != (long *)0x0) {
    (**(code **)(*DAT_007216d8 + 8))();
  }
  if (DAT_00720e58 == '\x01') {
    DAT_00720e58 = '\0';
    (*(code *)*_PythonParameter_default_instance_)();
  }
  if (DAT_007216e8 != (long *)0x0) {
    (**(code **)(*DAT_007216e8 + 8))();
  }
  if (DAT_00720e90 == '\x01') {
    DAT_00720e90 = '\0';
    (*(code *)*_RecurrentParameter_default_instance_)();
  }
  if (DAT_007216f8 != (long *)0x0) {
    (**(code **)(*DAT_007216f8 + 8))();
  }
  if (DAT_00720ec0 == '\x01') {
    DAT_00720ec0 = '\0';
    (*(code *)*_ReductionParameter_default_instance_)();
  }
  if (DAT_00721708 != (long *)0x0) {
    (**(code **)(*DAT_00721708 + 8))();
  }
  if (DAT_00720ee8 == '\x01') {
    DAT_00720ee8 = '\0';
    (*(code *)*_ReLUParameter_default_instance_)();
  }
  if (DAT_00721718 != (long *)0x0) {
    (**(code **)(*DAT_00721718 + 8))();
  }
  if (DAT_00720f18 == '\x01') {
    DAT_00720f18 = '\0';
    (*(code *)*_ReshapeParameter_default_instance_)();
  }
  if (DAT_00721728 != (long *)0x0) {
    (**(code **)(*DAT_00721728 + 8))();
  }
  if (DAT_00720f58 == '\x01') {
    DAT_00720f58 = '\0';
    (*(code *)*_ScaleParameter_default_instance_)();
  }
  if (DAT_00721738 != (long *)0x0) {
    (**(code **)(*DAT_00721738 + 8))();
  }
  if (DAT_00720f80 == '\x01') {
    DAT_00720f80 = '\0';
    (*(code *)*_SigmoidParameter_default_instance_)();
  }
  if (DAT_00721748 != (long *)0x0) {
    (**(code **)(*DAT_00721748 + 8))();
  }
  if (DAT_00720fb8 == '\x01') {
    DAT_00720fb8 = '\0';
    (*(code *)*_SliceParameter_default_instance_)();
  }
  if (DAT_00721758 != (long *)0x0) {
    (**(code **)(*DAT_00721758 + 8))();
  }
  if (DAT_00720fe0 == '\x01') {
    DAT_00720fe0 = '\0';
    (*(code *)*_SoftmaxParameter_default_instance_)();
  }
  if (DAT_00721768 != (long *)0x0) {
    (**(code **)(*DAT_00721768 + 8))();
  }
  if (DAT_00721008 == '\x01') {
    DAT_00721008 = '\0';
    (*(code *)*_TanHParameter_default_instance_)();
  }
  if (DAT_00721778 != (long *)0x0) {
    (**(code **)(*DAT_00721778 + 8))();
  }
  if (DAT_00721030 == '\x01') {
    DAT_00721030 = '\0';
    (*(code *)*_TileParameter_default_instance_)();
  }
  if (DAT_00721788 != (long *)0x0) {
    (**(code **)(*DAT_00721788 + 8))();
  }
  if (DAT_00721058 == '\x01') {
    DAT_00721058 = '\0';
    (*(code *)*_ThresholdParameter_default_instance_)();
  }
  if (DAT_00721798 != (long *)0x0) {
    (**(code **)(*DAT_00721798 + 8))();
  }
  if (DAT_007210b8 == '\x01') {
    DAT_007210b8 = '\0';
    (*(code *)*_WindowDataParameter_default_instance_)();
  }
  if (DAT_007217a8 != (long *)0x0) {
    (**(code **)(*DAT_007217a8 + 8))();
  }
  if (DAT_00721888 == '\x01') {
    DAT_00721888 = '\0';
    if (WindowDataParameter::_default_crop_mode__abi_cxx11_ != &DAT_00721878) {
      operator_delete(WindowDataParameter::_default_crop_mode__abi_cxx11_,DAT_00721878 + 1);
    }
  }
  if (DAT_007210e8 == '\x01') {
    DAT_007210e8 = '\0';
    (*(code *)*_SPPParameter_default_instance_)();
  }
  if (DAT_007217b8 != (long *)0x0) {
    (**(code **)(*DAT_007217b8 + 8))();
  }
  if (DAT_007212e0 == '\x01') {
    DAT_007212e0 = '\0';
    (*(code *)*_V1LayerParameter_default_instance_)();
  }
  if (DAT_007217c8 != (long *)0x0) {
    (**(code **)(*DAT_007217c8 + 8))();
  }
  if (DAT_007213e8 == '\x01') {
    DAT_007213e8 = '\0';
    (*(code *)*_V0LayerParameter_default_instance_)();
  }
  if (DAT_007217d8 != (long *)0x0) {
    (**(code **)(*DAT_007217d8 + 8))();
  }
  if (DAT_007218b0 == '\x01') {
    DAT_007218b0 = '\0';
    if (V0LayerParameter::_default_det_crop_mode__abi_cxx11_ != &DAT_007218a0) {
      operator_delete(V0LayerParameter::_default_det_crop_mode__abi_cxx11_,DAT_007218a0 + 1);
    }
  }
  if (DAT_00721418 == '\x01') {
    DAT_00721418 = '\0';
    (*(code *)*_PReLUParameter_default_instance_)();
  }
  if (DAT_007217e8 != (long *)0x0) {
    (**(code **)(*DAT_007217e8 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _BlobShape_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _BlobProto_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _BlobProtoVector_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _Datum_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
  _FillerParameter_default_instance_.Shutdown();
  delete file_level_metadata[4].reflection;
  FillerParameter::_default_type_.Shutdown();
  _NetParameter_default_instance_.Shutdown();
  delete file_level_metadata[5].reflection;
  _SolverParameter_default_instance_.Shutdown();
  delete file_level_metadata[6].reflection;
  SolverParameter::_default_regularization_type_.Shutdown();
  SolverParameter::_default_type_.Shutdown();
  _SolverState_default_instance_.Shutdown();
  delete file_level_metadata[7].reflection;
  _NetState_default_instance_.Shutdown();
  delete file_level_metadata[8].reflection;
  _NetStateRule_default_instance_.Shutdown();
  delete file_level_metadata[9].reflection;
  _ParamSpec_default_instance_.Shutdown();
  delete file_level_metadata[10].reflection;
  _LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[11].reflection;
  _TransformationParameter_default_instance_.Shutdown();
  delete file_level_metadata[12].reflection;
  _LossParameter_default_instance_.Shutdown();
  delete file_level_metadata[13].reflection;
  _AccuracyParameter_default_instance_.Shutdown();
  delete file_level_metadata[14].reflection;
  _ArgMaxParameter_default_instance_.Shutdown();
  delete file_level_metadata[15].reflection;
  _ConcatParameter_default_instance_.Shutdown();
  delete file_level_metadata[16].reflection;
  _BatchNormParameter_default_instance_.Shutdown();
  delete file_level_metadata[17].reflection;
  _BiasParameter_default_instance_.Shutdown();
  delete file_level_metadata[18].reflection;
  _ContrastiveLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[19].reflection;
  _ConvolutionParameter_default_instance_.Shutdown();
  delete file_level_metadata[20].reflection;
  _CropParameter_default_instance_.Shutdown();
  delete file_level_metadata[21].reflection;
  _DataParameter_default_instance_.Shutdown();
  delete file_level_metadata[22].reflection;
  _DropoutParameter_default_instance_.Shutdown();
  delete file_level_metadata[23].reflection;
  _DummyDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[24].reflection;
  _EltwiseParameter_default_instance_.Shutdown();
  delete file_level_metadata[25].reflection;
  _ELUParameter_default_instance_.Shutdown();
  delete file_level_metadata[26].reflection;
  _EmbedParameter_default_instance_.Shutdown();
  delete file_level_metadata[27].reflection;
  _ExpParameter_default_instance_.Shutdown();
  delete file_level_metadata[28].reflection;
  _FlattenParameter_default_instance_.Shutdown();
  delete file_level_metadata[29].reflection;
  _HDF5DataParameter_default_instance_.Shutdown();
  delete file_level_metadata[30].reflection;
  _HDF5OutputParameter_default_instance_.Shutdown();
  delete file_level_metadata[31].reflection;
  _HingeLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[32].reflection;
  _ImageDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[33].reflection;
  _InfogainLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[34].reflection;
  _InnerProductParameter_default_instance_.Shutdown();
  delete file_level_metadata[35].reflection;
  _InputParameter_default_instance_.Shutdown();
  delete file_level_metadata[36].reflection;
  _LogParameter_default_instance_.Shutdown();
  delete file_level_metadata[37].reflection;
  _LRNParameter_default_instance_.Shutdown();
  delete file_level_metadata[38].reflection;
  _MemoryDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[39].reflection;
  _MVNParameter_default_instance_.Shutdown();
  delete file_level_metadata[40].reflection;
  _ParameterParameter_default_instance_.Shutdown();
  delete file_level_metadata[41].reflection;
  _PoolingParameter_default_instance_.Shutdown();
  delete file_level_metadata[42].reflection;
  _PowerParameter_default_instance_.Shutdown();
  delete file_level_metadata[43].reflection;
  _PythonParameter_default_instance_.Shutdown();
  delete file_level_metadata[44].reflection;
  _RecurrentParameter_default_instance_.Shutdown();
  delete file_level_metadata[45].reflection;
  _ReductionParameter_default_instance_.Shutdown();
  delete file_level_metadata[46].reflection;
  _ReLUParameter_default_instance_.Shutdown();
  delete file_level_metadata[47].reflection;
  _ReshapeParameter_default_instance_.Shutdown();
  delete file_level_metadata[48].reflection;
  _ScaleParameter_default_instance_.Shutdown();
  delete file_level_metadata[49].reflection;
  _SigmoidParameter_default_instance_.Shutdown();
  delete file_level_metadata[50].reflection;
  _SliceParameter_default_instance_.Shutdown();
  delete file_level_metadata[51].reflection;
  _SoftmaxParameter_default_instance_.Shutdown();
  delete file_level_metadata[52].reflection;
  _TanHParameter_default_instance_.Shutdown();
  delete file_level_metadata[53].reflection;
  _TileParameter_default_instance_.Shutdown();
  delete file_level_metadata[54].reflection;
  _ThresholdParameter_default_instance_.Shutdown();
  delete file_level_metadata[55].reflection;
  _WindowDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[56].reflection;
  WindowDataParameter::_default_crop_mode_.Shutdown();
  _SPPParameter_default_instance_.Shutdown();
  delete file_level_metadata[57].reflection;
  _V1LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[58].reflection;
  _V0LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[59].reflection;
  V0LayerParameter::_default_det_crop_mode_.Shutdown();
  _PReLUParameter_default_instance_.Shutdown();
  delete file_level_metadata[60].reflection;
}